

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

string * testing::internal::CodePointToUtf8_abi_cxx11_(UInt32 code_point)

{
  UInt32 UVar1;
  uint in_ESI;
  string *in_RDI;
  char str [5];
  int in_stack_0000012c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *__lhs;
  allocator<char> local_62;
  byte local_61;
  byte local_60;
  byte local_5f;
  byte local_5e;
  undefined1 local_5d;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  string local_30 [36];
  uint local_c [3];
  
  if (in_ESI < 0x200000) {
    if (in_ESI < 0x80) {
      local_60 = 0;
      local_61 = (byte)in_ESI;
    }
    else {
      local_c[0] = in_ESI;
      if (in_ESI < 0x800) {
        local_5f = 0;
        UVar1 = ChopLowBits(local_c,6);
        local_60 = (byte)UVar1;
        local_61 = (byte)local_c[0] | 0xc0;
      }
      else if (in_ESI < 0x10000) {
        local_5e = 0;
        UVar1 = ChopLowBits(local_c,6);
        local_5f = (byte)UVar1 | 0x80;
        UVar1 = ChopLowBits(local_c,6);
        local_60 = (byte)UVar1;
        local_61 = (byte)local_c[0] | 0xe0;
      }
      else {
        local_5d = 0;
        UVar1 = ChopLowBits(local_c,6);
        local_5e = (byte)UVar1 | 0x80;
        UVar1 = ChopLowBits(local_c,6);
        local_5f = (byte)UVar1 | 0x80;
        UVar1 = ChopLowBits(local_c,6);
        local_60 = (byte)UVar1;
        local_61 = (byte)local_c[0] | 0xf0;
      }
      local_60 = local_60 | 0x80;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::allocator<char>::~allocator(&local_62);
  }
  else {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffffb0;
    __lhs = in_RDI;
    String::FormatHexInt_abi_cxx11_(in_stack_0000012c);
    std::operator+((char *)__lhs,__rhs);
    std::operator+(__lhs,(char *)__rhs);
    std::__cxx11::string::~string(local_30);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  }
  return in_RDI;
}

Assistant:

std::string CodePointToUtf8(UInt32 code_point) {
  if (code_point > kMaxCodePoint4) {
    return "(Invalid Unicode 0x" + String::FormatHexInt(code_point) + ")";
  }

  char str[5];  // Big enough for the largest valid code point.
  if (code_point <= kMaxCodePoint1) {
    str[1] = '\0';
    str[0] = static_cast<char>(code_point);                          // 0xxxxxxx
  } else if (code_point <= kMaxCodePoint2) {
    str[2] = '\0';
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xC0 | code_point);                   // 110xxxxx
  } else if (code_point <= kMaxCodePoint3) {
    str[3] = '\0';
    str[2] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xE0 | code_point);                   // 1110xxxx
  } else {  // code_point <= kMaxCodePoint4
    str[4] = '\0';
    str[3] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[2] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xF0 | code_point);                   // 11110xxx
  }
  return str;
}